

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::full_box::parse(full_box *this,char *ptr)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uint64_t offset;
  char *ptr_local;
  full_box *this_local;
  
  box::parse(&this->super_box,ptr);
  uVar2 = box::size(&this->super_box);
  uVar1 = anon_unknown.dwarf_1232e::fmp4_read_uint32(ptr + uVar2);
  this->magic_conf_ = uVar1;
  (this->super_box).field_0x62 = ptr[uVar2];
  uVar1 = anon_unknown.dwarf_1232e::fmp4_read_uint32(ptr + uVar2);
  *(uint32_t *)&(this->super_box).field_0x64 = uVar1 & 0xffffff;
  return;
}

Assistant:

void full_box::parse(char const *ptr)
	{
		box::parse(ptr);
		// read the version and flags
		uint64_t offset = box::size();
		magic_conf_ = fmp4_read_uint32(ptr + offset);
		this->version_ = *((const uint8_t *)((ptr + offset)));
		this->flags_ = ((uint32_t)(0x00FFFFFF)) & fmp4_read_uint32(ptr + offset);
	}